

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O3

void testAttrPreview(string *tempdir)

{
  exr_result_t eVar1;
  exr_context_t p_Var2;
  void *pvVar3;
  undefined4 *puVar4;
  ostream *poVar5;
  char *pcVar6;
  size_t sVar7;
  char *in_RCX;
  char *pcVar8;
  exr_context_t f;
  exr_context_t local_20;
  
  p_Var2 = createDummyFile("<preview>");
  local_20 = p_Var2;
  if (p_Var2 == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*p_Var2->report_error)(p_Var2,3,"Invalid reference to preview object to initialize");
    if (eVar1 == 3) {
      pcVar8 = (char *)0xffffffff;
      eVar1 = (*p_Var2->print_error)
                        (p_Var2,3,"Invalid very large size for preview image (%u x %u - %lu bytes)",
                         0xffffffff,0x40,0xffffffff00);
      if (eVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(eVar1);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(3);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        core_test_fail("exr_attr_preview_init (f, &p, (uint32_t) -1, 64)",(char *)0x32e,0x347276,
                       pcVar8);
      }
      pcVar8 = (char *)0x40;
      eVar1 = (*p_Var2->print_error)
                        (p_Var2,3,"Invalid very large size for preview image (%u x %u - %lu bytes)",
                         0x40,0xffffffff,0xffffffff00);
      if (eVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(eVar1);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(3);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        core_test_fail("exr_attr_preview_init (f, &p, 64, (uint32_t) -1)",(char *)0x331,0x347276,
                       pcVar8);
      }
      pvVar3 = (*p_Var2->alloc_fn)(4);
      if (pvVar3 == (void *)0x0) {
        eVar1 = (*p_Var2->standard_error)(p_Var2,1);
        if (eVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(eVar1);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          core_test_fail("exr_attr_preview_init (f, &p, 1, 1)",(char *)0x332,0x347276,pcVar8);
        }
        core_test_fail("p.width == 1",(char *)0x333,0x347276,pcVar8);
      }
      (*p_Var2->free_fn)(pvVar3);
      s_malloc_fail_on = 1;
      pvVar3 = (*p_Var2->alloc_fn)(4);
      if (pvVar3 == (void *)0x0) {
        eVar1 = (*p_Var2->standard_error)(p_Var2,1);
        s_malloc_fail_on = 0;
        if (eVar1 == 1) {
          puVar4 = (undefined4 *)(*p_Var2->alloc_fn)(4);
          if (puVar4 == (undefined4 *)0x0) {
            eVar1 = (*p_Var2->standard_error)(p_Var2,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
            pcVar6 = (char *)exr_get_default_error_message(eVar1);
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
            }
            else {
              sVar7 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            core_test_fail("exr_attr_preview_create (f, &p, 1, 1, data1x1)",(char *)0x33f,0x347276,
                           pcVar8);
          }
          *puVar4 = 0xefbeadde;
          (*p_Var2->free_fn)(puVar4);
          s_malloc_fail_on = 1;
          puVar4 = (undefined4 *)(*p_Var2->alloc_fn)(4);
          if (puVar4 == (undefined4 *)0x0) {
            eVar1 = (*p_Var2->standard_error)(p_Var2,1);
            s_malloc_fail_on = 0;
            if (eVar1 == 1) {
              exr_print_context_info(p_Var2,0);
              exr_print_context_info(p_Var2,1);
              exr_finish(&local_20);
              return;
            }
          }
          else {
            *puVar4 = 0xefbeadde;
            eVar1 = 0;
          }
          s_malloc_fail_on = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(eVar1);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(1);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          core_test_fail("exr_attr_preview_create (f, &p, 1, 1, data1x1)",(char *)0x34d,0x347276,
                         pcVar8);
        }
      }
      else {
        eVar1 = 0;
      }
      s_malloc_fail_on = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(eVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      core_test_fail("exr_attr_preview_init (f, &p, 1, 1)",(char *)0x33d,0x347276,pcVar8);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
  pcVar8 = (char *)exr_get_default_error_message(eVar1);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar7 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
  pcVar8 = (char *)exr_get_default_error_message(3);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar7 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,sVar7);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  core_test_fail("exr_attr_preview_init (f, __null, 64, 64)",(char *)0x328,0x347276,in_RCX);
}

Assistant:

void
testAttrPreview (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testPreviewHelper (NULL);
    exr_context_t f = createDummyFile ("<preview>");
    testPreviewHelper (f);
    exr_print_context_info (f, 0);
    exr_print_context_info (f, 1);
    exr_finish (&f);
}